

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationY<std::complex<float>_>::matrix(RotationY<std::complex<float>_> *this)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 *puVar3;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<float>_> SVar4;
  
  uVar1 = *(undefined4 *)(in_RSI + 0x10);
  uVar2 = *(uint *)(in_RSI + 0x14);
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)0x2;
  puVar3 = (undefined8 *)operator_new__(0x20);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *(undefined8 **)
   &(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.qubit_ =
       puVar3;
  *(undefined4 *)puVar3 = uVar1;
  *(undefined4 *)((long)puVar3 + 4) = 0;
  *(uint *)(puVar3 + 1) = uVar2;
  *(undefined4 *)((long)puVar3 + 0xc) = 0;
  *(uint *)(puVar3 + 2) = uVar2 ^ 0x80000000;
  *(undefined4 *)((long)puVar3 + 0x14) = 0;
  *(undefined4 *)(puVar3 + 3) = uVar1;
  *(undefined4 *)((long)puVar3 + 0x1c) = 0;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( this->cos() , -this->sin() ,
                                                  this->sin() ,  this->cos() ) ;
        }